

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

DisasJumpType op_oc(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *tcg_ctx;
  int val;
  uintptr_t o_1;
  TCGv_i32 pTVar1;
  TCGTemp *local_48;
  TCGTemp *local_40;
  TCGv_i64 local_38;
  TCGv_i64 local_30;
  
  tcg_ctx = s->uc->tcg_ctx;
  val = get_field1(s,FLD_O_l1,FLD_C_b4);
  pTVar1 = tcg_const_i32_s390x(tcg_ctx,val);
  local_48 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
  local_38 = o->addr1 + (long)tcg_ctx;
  local_30 = o->in2 + (long)tcg_ctx;
  local_40 = (TCGTemp *)(pTVar1 + (long)tcg_ctx);
  tcg_gen_callN_s390x(tcg_ctx,helper_oc,(TCGTemp *)(tcg_ctx->cc_op + (long)tcg_ctx),4,&local_48);
  tcg_temp_free_internal_s390x(tcg_ctx,(TCGTemp *)(pTVar1 + (long)tcg_ctx));
  set_cc_static(s);
  return DISAS_NEXT;
}

Assistant:

static DisasJumpType op_oc(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 l = tcg_const_i32(tcg_ctx, get_field(s, l1));
    gen_helper_oc(tcg_ctx, tcg_ctx->cc_op, tcg_ctx->cpu_env, l, o->addr1, o->in2);
    tcg_temp_free_i32(tcg_ctx, l);
    set_cc_static(s);
    return DISAS_NEXT;
}